

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O2

deUint8 __thiscall
deqp::gles31::Functional::anon_unknown_1::LineRenderCase::checkLineWidths
          (LineRenderCase *this,ConstPixelBufferAccess *access,IVec2 *begin,IVec2 *end,
          int componentNdx,int *messageLimitCounter)

{
  byte bVar1;
  int iVar2;
  RenderTarget *pRVar3;
  byte bVar4;
  int iVar5;
  int x;
  int detectedLineWidth;
  int iVar6;
  bool bVar7;
  IVec2 cursor;
  IVec2 advance;
  IVec2 local_68;
  LineRenderCase *local_60;
  int *local_58;
  int local_4c;
  int local_48 [4];
  ulong local_38;
  
  local_58 = messageLimitCounter;
  pRVar3 = Context::getRenderTarget((this->super_BBoxRenderCase).super_TestCase.m_context);
  if (this->m_isWideLineCase == false) {
    local_38 = 1;
  }
  else {
    local_38 = (ulong)(uint)this->m_wideLineLineWidth;
  }
  local_68.m_data[0] = (int)local_38;
  iVar5 = local_68.m_data[0] + 1;
  iVar2 = local_68.m_data[0];
  if (1 < pRVar3->m_numSamples) {
    iVar2 = iVar5;
  }
  iVar6 = begin->m_data[0];
  bVar7 = iVar6 == end->m_data[0];
  advance.m_data[0] = (int)!bVar7;
  advance.m_data[1] = (int)bVar7;
  detectedLineWidth = 0;
  x = (int)access;
  local_68.m_data[1] = iVar2;
  local_60 = this;
  tcu::ConstPixelBufferAccess::getPixelInt
            ((ConstPixelBufferAccess *)local_48,x,iVar6,begin->m_data[1]);
  if (local_48[componentNdx] == 0) {
    bVar7 = false;
  }
  else {
    tcu::operator-(begin,&advance);
    detectedLineWidth = 0;
    while (((-1 < cursor.m_data[0] && (-1 < cursor.m_data[1])) &&
           (tcu::ConstPixelBufferAccess::getPixelInt
                      ((ConstPixelBufferAccess *)local_48,x,cursor.m_data[0],cursor.m_data[1]),
           local_48[componentNdx] != 0))) {
      detectedLineWidth = detectedLineWidth + 1;
      tcu::Vector<int,_2>::operator-=(&cursor,&advance);
    }
    bVar7 = true;
  }
  local_4c = (int)local_38 + -1;
  tcu::Vector<int,_2>::Vector(&cursor,begin);
  bVar4 = 0;
  do {
    if ((cursor.m_data[0] == end->m_data[0]) && (cursor.m_data[1] == end->m_data[1])) {
      if (detectedLineWidth != 0) {
        tcu::Vector<int,_2>::Vector(&cursor,end);
        while ((cursor.m_data[0] < (access->m_size).m_data[0] &&
               (cursor.m_data[1] < (access->m_size).m_data[1]))) {
          tcu::ConstPixelBufferAccess::getPixelInt
                    ((ConstPixelBufferAccess *)local_48,x,cursor.m_data[0],cursor.m_data[1]);
          if (local_48[componentNdx] == 0) {
            iVar6 = 0;
            if ((detectedLineWidth != 0) && (iVar2 < detectedLineWidth)) {
              bVar4 = bVar4 | (iVar5 < detectedLineWidth) * '\x04' + 4U;
              printLineWidthError(local_60,&cursor,detectedLineWidth,&local_68,
                                  advance.m_data[0] == 0,local_58);
            }
          }
          else {
            iVar6 = detectedLineWidth + 1;
          }
          detectedLineWidth = iVar6;
          tcu::Vector<int,_2>::operator+=(&cursor,&advance);
        }
        if (iVar2 < detectedLineWidth) {
          bVar4 = (iVar5 < detectedLineWidth) * '\x04' + 4U | bVar4;
          printLineWidthError(local_60,&cursor,detectedLineWidth,&local_68,advance.m_data[0] == 0,
                              local_58);
        }
      }
      return bVar4;
    }
    tcu::ConstPixelBufferAccess::getPixelInt
              ((ConstPixelBufferAccess *)local_48,x,cursor.m_data[0],cursor.m_data[1]);
    if (local_48[componentNdx] == 0) {
      if (detectedLineWidth != 0) {
        if ((((int)local_38 <= detectedLineWidth) || (bVar7)) && (detectedLineWidth <= iVar2)) {
          bVar7 = false;
          detectedLineWidth = 0;
          goto LAB_013918ab;
        }
        if (((local_4c <= detectedLineWidth) || (bVar1 = 8, bVar7)) &&
           (bVar1 = 8, detectedLineWidth <= iVar5)) {
          bVar1 = 4;
        }
        bVar4 = bVar4 | bVar1;
        printLineWidthError(local_60,&cursor,detectedLineWidth,&local_68,advance.m_data[0] == 0,
                            local_58);
        bVar7 = false;
      }
      detectedLineWidth = 0;
    }
    else {
      detectedLineWidth = detectedLineWidth + 1;
    }
LAB_013918ab:
    tcu::Vector<int,_2>::operator+=(&cursor,&advance);
  } while( true );
}

Assistant:

deUint8 LineRenderCase::checkLineWidths (const tcu::ConstPixelBufferAccess& access, const tcu::IVec2& begin, const tcu::IVec2& end, int componentNdx, int& messageLimitCounter) const
{
	const bool			multisample				= m_context.getRenderTarget().getNumSamples() > 1;
	const int			lineRenderWidth			= (m_isWideLineCase) ? (m_wideLineLineWidth) : 1;
	const tcu::IVec2	lineWidthRange			= (multisample)
													? (tcu::IVec2(lineRenderWidth, lineRenderWidth+1))	// multisampled "smooth" lines may spread to neighboring pixel
													: (tcu::IVec2(lineRenderWidth, lineRenderWidth));
	const tcu::IVec2	relaxedLineWidthRange	= (tcu::IVec2(lineRenderWidth-1, lineRenderWidth+1));

	int					lineWidth				= 0;
	bool				bboxLimitedLine			= false;
	deUint8				errorMask				= 0;

	const tcu::IVec2	advance					= (begin.x() == end.x()) ? (tcu::IVec2(0, 1)) : (tcu::IVec2(1, 0));

	// fragments before begin?
	if (access.getPixelInt(begin.x(), begin.y())[componentNdx] != 0)
	{
		bboxLimitedLine = true;

		for (tcu::IVec2 cursor = begin - advance;; cursor -= advance)
		{
			if (cursor.x() < 0 || cursor.y() < 0)
			{
				break;
			}
			else if (access.getPixelInt(cursor.x(), cursor.y())[componentNdx] != 0)
			{
				++lineWidth;
			}
			else
				break;
		}
	}

	for (tcu::IVec2 cursor = begin; cursor != end; cursor += advance)
	{
		const bool hit = (access.getPixelInt(cursor.x(), cursor.y())[componentNdx] != 0);

		if (hit)
			++lineWidth;
		else if (lineWidth)
		{
			// Line is allowed to be be thinner if it borders the bbox boundary (since part of the line might have been discarded).
			const bool incorrectLineWidth = (lineWidth < lineWidthRange.x() && !bboxLimitedLine) || (lineWidth > lineWidthRange.y());

			if (incorrectLineWidth)
			{
				const bool incorrectRelaxedLineWidth = (lineWidth < relaxedLineWidthRange.x() && !bboxLimitedLine) || (lineWidth > relaxedLineWidthRange.y());

				if (incorrectRelaxedLineWidth)
					errorMask |= SCANRESULT_LINE_WIDTH_ERR_BIT;
				else
					errorMask |= SCANRESULT_LINE_WIDTH_WARN_BIT;

				printLineWidthError(cursor, lineWidth, lineWidthRange, advance.x() == 0, messageLimitCounter);
			}

			lineWidth = 0;
			bboxLimitedLine = false;
		}
	}

	// fragments after end?
	if (lineWidth)
	{
		for (tcu::IVec2 cursor = end;; cursor += advance)
		{
			if (cursor.x() >= access.getWidth() || cursor.y() >= access.getHeight())
			{
				if (lineWidth > lineWidthRange.y())
				{
					if (lineWidth > relaxedLineWidthRange.y())
						errorMask |= SCANRESULT_LINE_WIDTH_ERR_BIT;
					else
						errorMask |= SCANRESULT_LINE_WIDTH_WARN_BIT;

					printLineWidthError(cursor, lineWidth, lineWidthRange, advance.x() == 0, messageLimitCounter);
				}

				break;
			}
			else if (access.getPixelInt(cursor.x(), cursor.y())[componentNdx] != 0)
			{
				++lineWidth;
			}
			else if (lineWidth)
			{
				// only check that line width is not larger than expected. Line width may be smaller
				// since the scanning 'cursor' is now outside the bounding box.
				const bool incorrectLineWidth = (lineWidth > lineWidthRange.y());

				if (incorrectLineWidth)
				{
					const bool incorrectRelaxedLineWidth = (lineWidth > relaxedLineWidthRange.y());

					if (incorrectRelaxedLineWidth)
						errorMask |= SCANRESULT_LINE_WIDTH_ERR_BIT;
					else
						errorMask |= SCANRESULT_LINE_WIDTH_WARN_BIT;

					printLineWidthError(cursor, lineWidth, lineWidthRange, advance.x() == 0, messageLimitCounter);
				}

				lineWidth = 0;
			}
		}
	}

	return errorMask;
}